

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall
QMenuPrivate::popup(QMenuPrivate *this,QPoint *p,QAction *atAction,
                   PositionFunction *positionFunction)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QObject *obj;
  QScreen *pQVar8;
  QWindow *pQVar9;
  QGraphicsProxyWidget *pQVar10;
  QPushButton *pQVar11;
  QStyle *pQVar12;
  qsizetype qVar13;
  const_reference ppQVar14;
  const_iterator cVar15;
  const_iterator cVar16;
  QWidget *this_00;
  int *piVar17;
  QMenu *pQVar18;
  QMenuBar *pQVar19;
  QMenuBarPrivate *pQVar20;
  QMenuPrivate *pQVar21;
  QAction *in_RDX;
  QPoint *in_RSI;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  QMenu *m;
  QMenuBar *mb;
  bool doChildEffects;
  int vGuess;
  int hGuess;
  QMenu *caused;
  int subMenuOffset;
  int y;
  bool snapToMouse;
  int i2;
  int below_height;
  int newY;
  QAction *action;
  int above_height;
  int i;
  bool adjustToDesktop;
  int desktopFrame;
  QPushButton *causedButton;
  bool isEmbedded;
  bool actionListChanged;
  bool contextMenu;
  QMenu *parentMenu;
  QScreen *screen_1;
  bool screenSet;
  QMenu *q;
  QPoint actionTopLeft;
  QRect parentActionRect;
  QPoint mouse;
  anon_class_1_0_00000001 rectIsNull;
  QSize size;
  QSize menuSizeHint;
  QPoint pos;
  QRect screen;
  QAccessibleEvent event;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_widgets_qmenu_cpp:2311:34)>
  popupScreenGuard;
  int in_stack_fffffffffffffc68;
  DirFlags in_stack_fffffffffffffc6c;
  UIEffect in_stack_fffffffffffffc70;
  WidgetAttribute in_stack_fffffffffffffc74;
  QWidgetPrivate *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  QPoint *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  WindowHandleMode in_stack_fffffffffffffc94;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  undefined4 in_stack_fffffffffffffcd0;
  undefined1 on;
  WidgetAttribute in_stack_fffffffffffffcd4;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  byte local_25a;
  bool local_259;
  byte local_201;
  WidgetAttribute local_200;
  WidgetAttribute local_1fc;
  int local_1c4;
  int local_1b0;
  int local_1ac;
  byte local_1a5;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined1 local_e8 [16];
  QPointF local_d8;
  undefined1 *local_c4;
  QRect local_bc;
  undefined1 local_a9;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  QPoint local_98;
  undefined8 local_90;
  undefined1 *local_88;
  QPoint local_80;
  QPoint local_78;
  QRect local_70;
  QRect local_60;
  undefined1 *local_50;
  undefined1 *local_48;
  anon_class_8_1_8991fb9c_for_m_func local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  on = (undefined1)((uint)in_stack_fffffffffffffcd0 >> 0x18);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  obj = (QObject *)q_func(in_RDI);
  QGuiApplication::screenAt((QPoint *)in_RSI);
  QPointer<QScreen>::operator=
            ((QPointer<QScreen> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             (QScreen *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qmenu.cpp:2311:34)>
  ::QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_widgets_qmenu_cpp:2311:34)>
                 *)local_18,&local_40);
  if (in_RDI->scroll != (QMenuScroller *)0x0) {
    if (in_RDI->scroll->scrollOffset != 0) {
      *(ushort *)&in_RDI->field_0x420 = *(ushort *)&in_RDI->field_0x420 & 0xfffe | 1;
    }
    in_RDI->scroll->scrollOffset = 0;
    in_RDI->scroll->scrollFlags = '\0';
  }
  *(ushort *)&in_RDI->field_0x420 = *(ushort *)&in_RDI->field_0x420 & 0xf7ff;
  in_RDI->motions = 0;
  *(ushort *)&in_RDI->field_0x420 = *(ushort *)&in_RDI->field_0x420 & 0xefff | 0x1000;
  updateLayoutDirection
            ((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  QWidget::ensurePolished((QWidget *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  if (in_RDI->eventLoop == (QEventLoop *)0x0) {
    bVar2 = false;
    QWidgetPrivate::topData
              ((QWidgetPrivate *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    pQVar8 = ::QPointer::operator_cast_to_QScreen_((QPointer<QScreen> *)0x6478a6);
    if (pQVar8 == (QScreen *)0x0) {
      pQVar18 = qobject_cast<QMenu*>((QObject *)0x64790d);
      if (pQVar18 != (QMenu *)0x0) {
        QWidget::screen((QWidget *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        bVar2 = QWidgetPrivate::setScreen
                          ((QWidgetPrivate *)
                           CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                           (QScreen *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90))
        ;
        if (bVar2) {
          *(ushort *)&in_RDI->field_0x420 = *(ushort *)&in_RDI->field_0x420 & 0xfffe | 1;
        }
        bVar2 = true;
      }
    }
    else {
      bVar2 = QWidgetPrivate::setScreen
                        ((QWidgetPrivate *)
                         CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                         (QScreen *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      if (bVar2) {
        *(ushort *)&in_RDI->field_0x420 = *(ushort *)&in_RDI->field_0x420 & 0xfffe | 1;
      }
      bVar2 = true;
    }
    if ((!bVar2) &&
       (bVar2 = QWidgetPrivate::setScreenForPoint
                          (in_stack_fffffffffffffc78,
                           (QPoint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70)),
       bVar2)) {
      *(ushort *)&in_RDI->field_0x420 = *(ushort *)&in_RDI->field_0x420 & 0xfffe | 1;
    }
  }
  bVar2 = isContextMenu((QMenuPrivate *)0x6479bd);
  if ((bool)((byte)(*(ushort *)&in_RDI->field_0x420 >> 2) & 1) != bVar2) {
    in_RDI->field_0x420 = in_RDI->field_0x420 | 1;
    *(ushort *)&in_RDI->field_0x420 = *(ushort *)&in_RDI->field_0x420 & 0xfffb | (ushort)bVar2 << 2;
  }
  pQVar9 = QWidgetPrivate::windowHandle
                     ((QWidgetPrivate *)
                      CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                      in_stack_fffffffffffffc94);
  if (pQVar9 == (QWindow *)0x0) {
    QWidgetPrivate::createWinId
              ((QWidgetPrivate *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  }
  topCausedWidget((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  qobject_cast<QMenuBar*>((QObject *)0x647a7d);
  QWidget::setAttribute
            ((QWidget *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             in_stack_fffffffffffffcd4,(bool)on);
  QMenu::aboutToShow((QMenu *)0x647aa9);
  uVar1 = *(ushort *)&in_RDI->field_0x420;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  bVar3 = bypassGraphicsProxyWidget
                    ((QWidget *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  bVar2 = false;
  if (!bVar3) {
    pQVar10 = QWidgetPrivate::nearestGraphicsProxyWidget
                        ((QWidget *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    bVar2 = pQVar10 != (QGraphicsProxyWidget *)0x0;
  }
  if (bVar2) {
    local_60 = popupGeometry((QMenuPrivate *)
                             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                             (QScreen *)in_stack_fffffffffffffc78);
    local_50 = (undefined1 *)local_60._0_8_;
    local_48 = (undefined1 *)local_60._8_8_;
  }
  else {
    QGuiApplication::screenAt((QPoint *)in_RSI);
    local_70 = popupGeometry((QMenuPrivate *)
                             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                             (QScreen *)in_stack_fffffffffffffc78);
    local_50 = (undefined1 *)local_70._0_8_;
    local_48 = (undefined1 *)local_70._8_8_;
  }
  updateActionRects((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                    (QRect *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x647c17);
  pQVar11 = qobject_cast<QPushButton*>((QObject *)0x647c1f);
  if (((uVar1 & 1) == 0) || (pQVar11 == (QPushButton *)0x0)) {
    local_78 = *in_RSI;
  }
  else {
    QPushButtonPrivate::get((QPushButton *)0x647c49);
    local_80 = QPushButtonPrivate::adjustedMenuPosition
                         ((QPushButtonPrivate *)
                          CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    local_78 = local_80;
  }
  QGuiApplication::screenAt((QPoint *)&local_78);
  QPointer<QScreen>::operator=
            ((QPointer<QScreen> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             (QScreen *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_90 = (**(code **)(*(long *)obj + 0x70))();
  local_88 = (undefined1 *)local_90;
  bVar2 = std::function::operator_cast_to_bool((function<QPoint_(const_QSize_&)> *)0x647cf3);
  if (bVar2) {
    local_98 = std::function<QPoint_(const_QSize_&)>::operator()
                         ((function<QPoint_(const_QSize_&)> *)in_stack_fffffffffffffc78,
                          (QSize *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    local_78 = local_98;
  }
  pQVar12 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68))
  ;
  iVar4 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x20,0,obj);
  QWidget::window((QWidget *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  bVar2 = QWidget::testAttribute((QWidget *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
  local_1a5 = (bVar2 ^ 0xffU) & 1;
  iVar5 = QSize::height((QSize *)0x647d87);
  iVar6 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  if (iVar6 < iVar5) {
LAB_00647e20:
    local_9c = QSize::width((QSize *)0x647e2d);
    local_a0 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    local_a0 = local_a0 + iVar4 * -2;
    qMin<int>(&local_9c,&local_a0);
    QSize::setWidth((QSize *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                    in_stack_fffffffffffffc6c);
    local_a4 = QSize::height((QSize *)0x647e84);
    local_a8 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68))
    ;
    local_a8 = local_a8 + iVar4 * -2;
    qMin<int>(&local_a4,&local_a8);
    QSize::setHeight((QSize *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc6c);
    local_1a5 = 1;
  }
  else {
    iVar5 = QSize::width((QSize *)0x647db5);
    iVar6 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    if (iVar6 < iVar5) goto LAB_00647e20;
    if (1 < in_RDI->ncols) {
      iVar5 = QSize::height((QSize *)0x647dfb);
      iVar6 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      if (iVar5 < iVar6) goto LAB_00647e20;
    }
  }
  if (in_RDI->ncols < 2) {
    if (in_RDX != (QAction *)0x0) {
      local_1b0 = 0;
      for (local_1ac = 0; qVar13 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions),
          local_1ac < qVar13; local_1ac = local_1ac + 1) {
        ppQVar14 = QList<QAction_*>::at
                             ((QList<QAction_*> *)
                              CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                              CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
        if (*ppQVar14 == in_RDX) {
          iVar5 = QPoint::y((QPoint *)0x647fb9);
          if ((in_RDI->scroll != (QMenuScroller *)0x0) && (iVar5 - local_1b0 < iVar4)) {
            in_RDI->scroll->scrollFlags = in_RDI->scroll->scrollFlags | 1;
            in_RDI->scroll->scrollOffset = iVar5 - local_1b0;
          }
          QPoint::setY((QPoint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       in_stack_fffffffffffffc6c);
          if ((in_RDI->scroll != (QMenuScroller *)0x0) && (in_RDI->scroll->scrollFlags != '\0')) {
            pQVar12 = QWidget::style((QWidget *)
                                     CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
            iVar5 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,0x2d,0,obj);
            if (iVar5 == 0) {
              for (local_1c4 = local_1ac; qVar13 = QList<QRect>::size(&in_RDI->actionRects),
                  local_1c4 < qVar13; local_1c4 = local_1c4 + 1) {
                QList<QRect>::at((QList<QRect> *)
                                 CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                                 CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
                QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68)
                             );
              }
              QSize::setHeight((QSize *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ),in_stack_fffffffffffffc6c);
            }
          }
          break;
        }
        QList<QRect>::at((QList<QRect> *)
                         CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
        iVar5 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68)
                             );
        local_1b0 = iVar5 + local_1b0;
      }
    }
  }
  else {
    QRect::top((QRect *)0x647ef7);
    QPoint::setY((QPoint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 in_stack_fffffffffffffc6c);
  }
  local_a9 = 0xaa;
  local_bc = QWidget::childrenRect
                       ((QWidget *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  bVar2 = QRect::isEmpty((QRect *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  local_259 = false;
  if (bVar2) {
    cVar15 = QList<QRect>::cbegin
                       ((QList<QRect> *)
                        CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    cVar16 = QList<QRect>::cend((QList<QRect> *)
                                CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    local_259 = std::
                all_of<QList<QRect>::const_iterator,QMenuPrivate::popup(QPoint_const&,QAction*,std::function<QPoint(QSize_const&)>)::__1>
                          (cVar15.i,cVar16.i);
  }
  if (local_259 != false) {
    in_RDI->eventLoop = (QEventLoop *)0x0;
    QPointer<QAction>::operator=
              ((QPointer<QAction> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               (QAction *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    goto LAB_00649577;
  }
  local_c4 = &DAT_aaaaaaaaaaaaaaaa;
  local_c4 = (undefined1 *)QGuiApplicationPrivate::QLastCursorPosition::toPoint();
  local_d8 = QGuiApplicationPrivate::QLastCursorPosition::operator_cast_to_QPointF
                       ((QLastCursorPosition *)in_stack_fffffffffffffc78);
  (in_RDI->mousePopupPos).xp = local_d8.xp;
  (in_RDI->mousePopupPos).yp = local_d8.yp;
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x648302);
  local_25a = 0;
  if (!bVar2) {
    QPoint::x((QPoint *)0x64831f);
    QPoint::y((QPoint *)0x648336);
    QRect::QRect((QRect *)in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,
                 in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68);
    local_25a = QRect::contains((QPoint *)local_e8,SUB81(&local_c4,0));
  }
  local_25a = local_25a & 1;
  if (local_1a5 != 0) {
    bVar2 = QWidget::isRightToLeft((QWidget *)0x6483a1);
    if (bVar2) {
      if (local_25a != 0) {
        QPoint::x((QPoint *)0x6483c1);
        QSize::width((QSize *)0x6483d5);
        QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc6c);
      }
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x6483ff);
      pQVar19 = qobject_cast<QMenuBar*>((QObject *)0x648407);
      if (pQVar19 == (QMenuBar *)0x0) {
        ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x648421);
        pQVar18 = qobject_cast<QMenu*>((QObject *)0x648429);
        if (pQVar18 != (QMenu *)0x0) goto LAB_0064842f;
      }
      else {
LAB_0064842f:
        iVar5 = QSize::width((QSize *)0x64843c);
        piVar17 = QPoint::rx((QPoint *)0x648450);
        *piVar17 = *piVar17 - iVar5;
      }
      iVar5 = QPoint::x((QPoint *)0x64846a);
      iVar6 = QRect::left((QRect *)0x64847e);
      if (iVar5 < iVar6 + iVar4) {
        local_ec = QPoint::x((QPoint *)0x64849f);
        local_f0 = QRect::left((QRect *)0x6484b3);
        local_f0 = local_f0 + iVar4;
        qMax<int>(&local_ec,&local_f0);
        QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc6c);
      }
      iVar5 = QPoint::x((QPoint *)0x6484f2);
      iVar6 = QSize::width((QSize *)0x648506);
      iVar7 = QRect::right((QRect *)0x648528);
      if (iVar7 - iVar4 < iVar5 + iVar6 + -1) {
        iVar5 = QPoint::x((QPoint *)0x64854d);
        local_f4 = QSize::width((QSize *)0x648561);
        local_f4 = iVar5 - local_f4;
        iVar5 = QRect::right((QRect *)0x648580);
        iVar6 = QSize::width((QSize *)0x64859b);
        local_f8 = ((iVar5 - iVar4) - iVar6) + 1;
        qMax<int>(&local_f4,&local_f8);
        QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc6c);
      }
    }
    else {
      iVar5 = QPoint::x((QPoint *)0x6485e6);
      iVar6 = QSize::width((QSize *)0x6485fa);
      iVar7 = QRect::right((QRect *)0x64861c);
      if (iVar7 - iVar4 < iVar5 + iVar6 + -1) {
        QRect::right((QRect *)0x64863d);
        QSize::width((QSize *)0x648658);
        QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc6c);
      }
      iVar5 = QPoint::x((QPoint *)0x64867e);
      iVar6 = QRect::left((QRect *)0x648692);
      if (iVar5 < iVar6 + iVar4) {
        QRect::left((QRect *)0x6486b3);
        QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc6c);
      }
    }
    iVar5 = QPoint::y((QPoint *)0x6486d8);
    iVar6 = QSize::height((QSize *)0x6486ec);
    iVar5 = iVar5 + iVar6 + -1;
    iVar6 = QRect::bottom((QRect *)0x64870e);
    if (iVar6 - iVar4 < iVar5) {
      if (local_25a == 0) {
        iVar5 = QPoint::y((QPoint *)0x6487e1);
        iVar6 = QSize::height((QSize *)0x6487f5);
        local_104 = iVar5 - (iVar6 + iVar4);
        iVar5 = QRect::bottom((QRect *)0x64881b);
        iVar6 = QSize::height((QSize *)0x648836);
        local_108 = ((iVar5 - iVar4) - iVar6) + 1;
        qMax<int>(&local_104,&local_108);
        QPoint::setY((QPoint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc6c);
      }
      else {
        iVar5 = QPoint::y((QPoint *)0x648741);
        iVar6 = QSize::height((QSize *)0x648755);
        local_fc = iVar5 - (iVar6 + iVar4);
        iVar5 = QRect::bottom((QRect *)0x64877b);
        iVar6 = QSize::height((QSize *)0x648796);
        local_100 = ((iVar5 - iVar4) - iVar6) + 1;
        qMin<int>(&local_fc,&local_100);
        QPoint::setY((QPoint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc6c);
      }
    }
    iVar5 = QPoint::y((QPoint *)0x64887e);
    iVar6 = QRect::top((QRect *)0x648892);
    if (iVar5 < iVar6 + iVar4) {
      QRect::top((QRect *)0x6488b3);
      QPoint::setY((QPoint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                   in_stack_fffffffffffffc6c);
    }
    iVar5 = QPoint::y((QPoint *)0x6488d6);
    iVar6 = QSize::height((QSize *)0x6488ea);
    iVar7 = QRect::bottom((QRect *)0x64890c);
    if (iVar7 - iVar4 < iVar5 + iVar6 + -1) {
      if (in_RDI->scroll == (QMenuScroller *)0x0) {
        QRect::bottom((QRect *)0x6489d6);
        QSize::height((QSize *)0x6489ea);
        QPoint::setY((QPoint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc6c);
      }
      else {
        in_RDI->scroll->scrollFlags = in_RDI->scroll->scrollFlags | 2;
        local_10c = QRect::y((QRect *)0x648960);
        local_110 = QPoint::y((QPoint *)0x648974);
        qMax<int>(&local_10c,&local_110);
        QRect::bottom((QRect *)0x6489a6);
        QSize::setHeight((QSize *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         in_stack_fffffffffffffc6c);
      }
    }
  }
  pQVar12 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68))
  ;
  iVar4 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x57,0,obj);
  ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x648a4a);
  this_00 = &qobject_cast<QMenu*>((QObject *)0x648a52)->super_QWidget;
  if (this_00 != (QWidget *)0x0) {
    QWidget::geometry(this_00);
    iVar5 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    iVar6 = QSize::width((QSize *)0x648a92);
    iVar7 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    if (iVar5 + iVar6 + iVar4 < iVar7) {
      QMenu::d_func((QMenu *)0x648af4);
      QMenu::d_func((QMenu *)0x648b09);
      actionRect((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                 (QAction *)in_stack_fffffffffffffc88);
      QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      QWidget::mapToGlobal
                ((QWidget *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                 (QPoint *)in_stack_fffffffffffffc78);
      QRect::moveTopLeft((QRect *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         (QPoint *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      bVar2 = QWidget::isRightToLeft((QWidget *)0x648ba0);
      if (bVar2) {
        iVar5 = QPoint::x((QPoint *)0x648bb6);
        iVar6 = QSize::width((QSize *)0x648bca);
        iVar7 = QRect::left((QRect *)0x648be9);
        if (iVar7 - iVar4 < iVar5 + iVar6) {
          iVar4 = QPoint::x((QPoint *)0x648c0e);
          iVar5 = QRect::right((QRect *)0x648c22);
          if (iVar4 < iVar5) {
            iVar4 = QRect::left((QRect *)0x648c40);
            iVar5 = QSize::width((QSize *)0x648c54);
            piVar17 = QPoint::rx((QPoint *)0x648c73);
            *piVar17 = iVar4 - iVar5;
            iVar4 = QPoint::x((QPoint *)0x648c89);
            iVar5 = QRect::x((QRect *)0x648c9d);
            if (iVar4 < iVar5) {
              iVar4 = QRect::right((QRect *)0x648cb7);
              piVar17 = QPoint::rx((QPoint *)0x648ccb);
              *piVar17 = iVar4;
            }
            iVar4 = QPoint::x((QPoint *)0x648ce1);
            iVar5 = QSize::width((QSize *)0x648cf5);
            iVar6 = QRect::x((QRect *)0x648d14);
            iVar7 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffc6c,
                                                   in_stack_fffffffffffffc68));
            if (iVar6 + iVar7 < iVar4 + iVar5) {
              iVar4 = QRect::x((QRect *)0x648d4b);
              piVar17 = QPoint::rx((QPoint *)0x648d5f);
              *piVar17 = iVar4;
            }
          }
        }
      }
      else {
        iVar5 = QPoint::x((QPoint *)0x648d7c);
        iVar6 = QRect::right((QRect *)0x648d90);
        if (iVar5 < iVar6 + iVar4) {
          iVar4 = QPoint::x((QPoint *)0x648db5);
          iVar5 = QSize::width((QSize *)0x648dc9);
          iVar6 = QRect::left((QRect *)0x648de8);
          if (iVar6 < iVar4 + iVar5) {
            iVar4 = QRect::right((QRect *)0x648e06);
            piVar17 = QPoint::rx((QPoint *)0x648e1a);
            *piVar17 = iVar4;
            iVar4 = QPoint::x((QPoint *)0x648e30);
            iVar5 = QSize::width((QSize *)0x648e44);
            iVar6 = QRect::x((QRect *)0x648e63);
            iVar7 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffc6c,
                                                   in_stack_fffffffffffffc68));
            if (iVar6 + iVar7 < iVar4 + iVar5) {
              iVar4 = QRect::left((QRect *)0x648e9a);
              iVar5 = QSize::width((QSize *)0x648eab);
              piVar17 = QPoint::rx((QPoint *)0x648ec4);
              *piVar17 = iVar4 - iVar5;
            }
            iVar4 = QPoint::x((QPoint *)0x648ed7);
            iVar5 = QRect::x((QRect *)0x648ee8);
            if (iVar4 < iVar5) {
              iVar5 = QRect::x((QRect *)0x648eff);
              iVar4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffc6c,
                                                     in_stack_fffffffffffffc68));
              iVar5 = iVar5 + iVar4;
              iVar4 = QSize::width((QSize *)0x648f29);
              iVar5 = iVar5 - iVar4;
              piVar17 = QPoint::rx((QPoint *)0x648f42);
              *piVar17 = iVar5;
            }
          }
        }
      }
    }
  }
  QGuiApplication::screenAt((QPoint *)&local_78);
  QPointer<QScreen>::operator=
            ((QPointer<QScreen> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             (QScreen *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc88,
               (QSize *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  QWidget::setGeometry
            ((QWidget *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
             (QRect *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  bVar2 = QWidget::isRightToLeft((QWidget *)0x648fbb);
  local_1fc = WA_MouseTracking;
  if (bVar2) {
    local_1fc = WA_UnderMouse;
  }
  local_200 = WA_PaintOnScreen;
  bVar2 = QWidget::isRightToLeft((QWidget *)0x648fec);
  if (bVar2) {
    if (local_25a == 0) {
LAB_00649048:
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x64905c);
      pQVar18 = qobject_cast<QMenu*>((QObject *)0x649064);
      if (pQVar18 != (QMenu *)0x0) {
        iVar4 = QPoint::x((QPoint *)0x649077);
        iVar5 = QSize::width((QSize *)0x649088);
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x6490b0);
        iVar6 = QWidget::x((QWidget *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80))
        ;
        if (iVar6 < iVar4 + iVar5 / 2) goto LAB_006490c2;
      }
    }
    else {
      iVar4 = QPoint::x((QPoint *)0x64900c);
      iVar5 = QSize::width((QSize *)0x64901d);
      iVar6 = QPoint::x((QPoint *)0x64903e);
      if (iVar4 + iVar5 / 2 <= iVar6) goto LAB_00649048;
LAB_006490c2:
      local_1fc = WA_MouseTracking;
    }
  }
  else if (local_25a == 0) {
LAB_00649125:
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x649139);
    pQVar18 = qobject_cast<QMenu*>((QObject *)0x649141);
    if (pQVar18 != (QMenu *)0x0) {
      iVar5 = QPoint::x((QPoint *)0x649154);
      iVar4 = QSize::width((QSize *)0x649165);
      iVar5 = iVar5 + iVar4 / 2;
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x64918d);
      iVar4 = QWidget::x((QWidget *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
      if (iVar5 < iVar4) goto LAB_0064919f;
    }
  }
  else {
    iVar4 = QPoint::x((QPoint *)0x6490e9);
    iVar5 = QSize::width((QSize *)0x6490fa);
    iVar6 = QPoint::x((QPoint *)0x64911b);
    if (iVar6 <= iVar4 + iVar5 / 2) goto LAB_00649125;
LAB_0064919f:
    local_1fc = WA_UnderMouse;
  }
  if (local_25a == 0) {
LAB_00649209:
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x64921d);
    pQVar19 = qobject_cast<QMenuBar*>((QObject *)0x649225);
    bVar2 = false;
    if (pQVar19 != (QMenuBar *)0x0) {
      in_stack_fffffffffffffc84 = QPoint::y((QPoint *)0x649245);
      iVar4 = QSize::width((QSize *)0x649256);
      iVar4 = in_stack_fffffffffffffc84 + iVar4 / 2;
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x64927e);
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x649297);
      QWidget::pos((QWidget *)in_stack_fffffffffffffc78);
      QWidget::mapToGlobal
                ((QWidget *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                 (QPoint *)in_stack_fffffffffffffc78);
      iVar5 = QPoint::y((QPoint *)0x6492ce);
      bVar2 = iVar4 < iVar5;
    }
  }
  else {
    iVar5 = QPoint::y((QPoint *)0x6491c3);
    iVar4 = QSize::height((QSize *)0x6491d4);
    iVar5 = iVar5 + iVar4 / 2;
    iVar4 = QPoint::y((QPoint *)0x6491f5);
    bVar2 = true;
    if (iVar4 <= iVar5) goto LAB_00649209;
  }
  if (bVar2) {
    local_200 = WA_OpaquePaintEvent;
  }
  bVar2 = QApplication::isEffectEnabled(in_stack_fffffffffffffc70);
  if (bVar2) {
    local_201 = 1;
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x649329);
    pQVar19 = qobject_cast<QMenuBar*>((QObject *)0x649331);
    if (pQVar19 == (QMenuBar *)0x0) {
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x64938a);
      pQVar18 = qobject_cast<QMenu*>((QObject *)0x649392);
      if (pQVar18 != (QMenu *)0x0) {
        pQVar21 = QMenu::d_func((QMenu *)0x6493b2);
        local_201 = (byte)((ushort)*(undefined2 *)&pQVar21->field_0x420 >> 0xc) & 1;
        pQVar21 = QMenu::d_func((QMenu *)0x6493d7);
        *(ushort *)&pQVar21->field_0x420 = *(ushort *)&pQVar21->field_0x420 & 0xefff;
      }
    }
    else {
      pQVar20 = QMenuBar::d_func((QMenuBar *)0x649351);
      local_201 = pQVar20->doChildEffects & 1;
      pQVar20 = QMenuBar::d_func((QMenuBar *)0x64936d);
      pQVar20->doChildEffects = false;
    }
    if (local_201 == 0) {
      qFadeEffect((QWidget *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                  in_stack_fffffffffffffc6c);
      qScrollEffect((QWidget *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                    in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68);
      QWidget::show((QWidget *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
    }
    else {
      bVar2 = QApplication::isEffectEnabled(in_stack_fffffffffffffc70);
      if (bVar2) {
        qFadeEffect((QWidget *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                    in_stack_fffffffffffffc6c);
      }
      else {
        bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x649439);
        if (bVar2) {
          ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x649460);
          pQVar18 = qobject_cast<QMenu*>((QObject *)0x649468);
          in_stack_fffffffffffffc74 = local_200;
          if (pQVar18 != (QMenu *)0x0) {
            in_stack_fffffffffffffc74 = local_1fc;
          }
          qScrollEffect((QWidget *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                        in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68);
        }
        else {
          qScrollEffect((QWidget *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                        in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68);
        }
      }
    }
  }
  else {
    QWidget::show((QWidget *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QAccessibleEvent::QAccessibleEvent((QAccessibleEvent *)&local_38,obj,PopupMenuStart);
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_38);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_38);
LAB_00649577:
  QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qmenu.cpp:2311:34)>
  ::~QScopeGuard((QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_widgets_widgets_qmenu_cpp:2311:34)>
                  *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::popup(const QPoint &p, QAction *atAction, PositionFunction positionFunction)
{
    Q_Q(QMenu);
    popupScreen = QGuiApplication::screenAt(p);
    QScopeGuard popupScreenGuard([this](){ popupScreen.clear(); });

    if (scroll) { // reset scroll state from last popup
        if (scroll->scrollOffset)
            itemsDirty = 1; // sizeHint will be incorrect if there is previous scroll
        scroll->scrollOffset = 0;
        scroll->scrollFlags = QMenuPrivate::QMenuScroller::ScrollNone;
    }
    tearoffHighlighted = 0;
    motions = 0;
    doChildEffects = true;
    updateLayoutDirection();

    q->ensurePolished(); // Get the right font

    // Ensure that we get correct sizeHints by placing this window on the correct screen.
    // However if the QMenu was constructed with a Qt::Desktop widget as its parent,
    // then initialScreenIndex was set, so we should respect that for the lifetime of this menu.
    // However if eventLoop exists, then exec() already did this by calling createWinId(); so leave it alone. (QTBUG-76162)
    if (!eventLoop) {
        bool screenSet = false;
        QScreen *screen = topData()->initialScreen;
        if (screen) {
            if (setScreen(screen))
                itemsDirty = true;
            screenSet = true;
        } else if (QMenu *parentMenu = qobject_cast<QMenu *>(parent)) {
            // a submenu is always opened from an open parent menu,
            // so show it on the same screen where the parent is. (QTBUG-76162)
            if (setScreen(parentMenu->screen()))
                itemsDirty = true;
            screenSet = true;
        }
        if (!screenSet && setScreenForPoint(p))
            itemsDirty = true;
    }

    const bool contextMenu = isContextMenu();
    if (lastContextMenu != contextMenu) {
        itemsDirty = true;
        lastContextMenu = contextMenu;
    }

    // Until QWidget::metric accepts the screen set on a widget (without having a window handle)
    // we need to make sure we get a window handle. This must be done near here because
    // we want the screen to be correctly set and items to be marked dirty.
    // (and screen set could 'fail' on oldscreen == newScreen if created before causing the
    // itemsDirty not to be set though needed to get the correct size on first show).
    if (!windowHandle()) {
        createWinId();
    }

#if QT_CONFIG(menubar)
    // if this menu is part of a chain attached to a QMenuBar, set the
    // _NET_WM_WINDOW_TYPE_DROPDOWN_MENU X11 window type
    q->setAttribute(Qt::WA_X11NetWmWindowTypeDropDownMenu, qobject_cast<QMenuBar *>(topCausedWidget()) != nullptr);
#endif

    emit q->aboutToShow();
    const bool actionListChanged = itemsDirty;

    QRect screen;
#if QT_CONFIG(graphicsview)
    bool isEmbedded = !bypassGraphicsProxyWidget(q) && QMenuPrivate::nearestGraphicsProxyWidget(q);
    if (isEmbedded)
        screen = popupGeometry();
    else
#endif
    screen = popupGeometry(QGuiApplication::screenAt(p));
    updateActionRects(screen);

    QPoint pos;
    QPushButton *causedButton = qobject_cast<QPushButton*>(causedPopup.widget);
    if (actionListChanged && causedButton)
        pos = QPushButtonPrivate::get(causedButton)->adjustedMenuPosition();
    else
        pos = p;
    popupScreen = QGuiApplication::screenAt(pos);

    const QSize menuSizeHint(q->sizeHint());
    QSize size = menuSizeHint;

    if (positionFunction)
        pos = positionFunction(menuSizeHint);

    const int desktopFrame = q->style()->pixelMetric(QStyle::PM_MenuDesktopFrameWidth, nullptr, q);
    bool adjustToDesktop = !q->window()->testAttribute(Qt::WA_DontShowOnScreen);

    // if the screens have very different geometries and the menu is too big, we have to recalculate
    if ((size.height() > screen.height() || size.width() > screen.width()) ||
        // Layout is not right, we might be able to save horizontal space
        (ncols >1 && size.height() < screen.height())) {
        size.setWidth(qMin(menuSizeHint.width(), screen.width() - desktopFrame * 2));
        size.setHeight(qMin(menuSizeHint.height(), screen.height() - desktopFrame * 2));
        adjustToDesktop = true;
    }

#ifdef QT_KEYPAD_NAVIGATION
    if (!atAction && QApplicationPrivate::keypadNavigationEnabled()) {
        // Try to have one item activated
        if (defaultAction && defaultAction->isEnabled()) {
            atAction = defaultAction;
            // TODO: This works for first level menus, not yet sub menus
        } else {
            for (QAction *action : std::as_const(actions))
                if (action->isEnabled()) {
                    atAction = action;
                    break;
                }
        }
        currentAction = atAction;
    }
#endif
    if (ncols > 1) {
        pos.setY(screen.top() + desktopFrame);
    } else if (atAction) {
        for (int i = 0, above_height = 0; i < actions.size(); i++) {
            QAction *action = actions.at(i);
            if (action == atAction) {
                int newY = pos.y() - above_height;
                if (scroll && newY < desktopFrame) {
                    scroll->scrollFlags = scroll->scrollFlags
                                             | QMenuPrivate::QMenuScroller::ScrollUp;
                    scroll->scrollOffset = newY;
                    newY = desktopFrame;
                }
                pos.setY(newY);

                if (scroll && scroll->scrollFlags != QMenuPrivate::QMenuScroller::ScrollNone
                    && !q->style()->styleHint(QStyle::SH_Menu_FillScreenWithScroll, nullptr, q)) {
                    int below_height = above_height + scroll->scrollOffset;
                    for (int i2 = i; i2 < actionRects.size(); i2++)
                        below_height += actionRects.at(i2).height();
                    size.setHeight(below_height);
                }
                break;
            } else {
                above_height += actionRects.at(i).height();
            }
        }
    }

    // Do nothing if we don't have a valid size, e.g. when all actions are invisible
    // and there are no child widgets.
    const auto rectIsNull = [](const QRect &rect) { return rect.isNull(); };
    if (q->childrenRect().isEmpty()
     && std::all_of(actionRects.cbegin(), actionRects.cend(), rectIsNull)) {
        eventLoop = nullptr;
        syncAction = nullptr;
        return;
    }

    // Note that QGuiApplicationPrivate::lastCursorPosition isn't a QPointF,
    // so these two statements can't be simplified...
    const QPoint mouse = QGuiApplicationPrivate::lastCursorPosition.toPoint();
    mousePopupPos = QGuiApplicationPrivate::lastCursorPosition;
    const bool snapToMouse = !causedPopup.widget && (QRect(p.x() - 3, p.y() - 3, 6, 6).contains(mouse));

    if (adjustToDesktop) {
        // handle popup falling "off screen"
        if (q->isRightToLeft()) {
            if (snapToMouse) // position flowing left from the mouse
                pos.setX(mouse.x() - size.width());

#if QT_CONFIG(menubar)
            // if the menu is in a menubar or is a submenu, it should be right-aligned
            if (qobject_cast<QMenuBar*>(causedPopup.widget) || qobject_cast<QMenu*>(causedPopup.widget))
                pos.rx() -= size.width();
#endif // QT_CONFIG(menubar)

            if (pos.x() < screen.left() + desktopFrame)
                pos.setX(qMax(p.x(), screen.left() + desktopFrame));
            if (pos.x() + size.width() - 1 > screen.right() - desktopFrame)
                pos.setX(qMax(p.x() - size.width(), screen.right() - desktopFrame - size.width() + 1));
        } else {
            if (pos.x() + size.width() - 1 > screen.right() - desktopFrame)
                pos.setX(screen.right() - desktopFrame - size.width() + 1);
            if (pos.x() < screen.left() + desktopFrame)
                pos.setX(screen.left() + desktopFrame);
        }
        if (pos.y() + size.height() - 1 > screen.bottom() - desktopFrame) {
            if (snapToMouse)
                pos.setY(qMin(mouse.y() - (size.height() + desktopFrame), screen.bottom()-desktopFrame-size.height()+1));
            else
                pos.setY(qMax(p.y() - (size.height() + desktopFrame), screen.bottom()-desktopFrame-size.height()+1));
        }

        if (pos.y() < screen.top() + desktopFrame)
            pos.setY(screen.top() + desktopFrame);
        if (pos.y() + menuSizeHint.height() - 1 > screen.bottom() - desktopFrame) {
            if (scroll) {
                scroll->scrollFlags |= uint(QMenuPrivate::QMenuScroller::ScrollDown);
                int y = qMax(screen.y(),pos.y());
                size.setHeight(screen.bottom() - (desktopFrame * 2) - y);
            } else {
                // Too big for screen, bias to see bottom of menu (for some reason)
                pos.setY(screen.bottom() - size.height() + 1);
            }
        }
    }

    const int subMenuOffset = q->style()->pixelMetric(QStyle::PM_SubMenuOverlap, nullptr, q);
    QMenu *caused = qobject_cast<QMenu*>(causedPopup.widget);
    if (caused && caused->geometry().width() + menuSizeHint.width() + subMenuOffset < screen.width()) {
        QRect parentActionRect(caused->d_func()->actionRect(caused->d_func()->currentAction));
        const QPoint actionTopLeft = caused->mapToGlobal(parentActionRect.topLeft());
        parentActionRect.moveTopLeft(actionTopLeft);
        if (q->isRightToLeft()) {
            if ((pos.x() + menuSizeHint.width() > parentActionRect.left() - subMenuOffset)
                && (pos.x() < parentActionRect.right()))
            {
                pos.rx() = parentActionRect.left() - menuSizeHint.width();
                if (pos.x() < screen.x())
                    pos.rx() = parentActionRect.right();
                if (pos.x() + menuSizeHint.width() > screen.x() + screen.width())
                    pos.rx() = screen.x();
            }
        } else {
            if ((pos.x() < parentActionRect.right() + subMenuOffset)
                && (pos.x() + menuSizeHint.width() > parentActionRect.left()))
            {
                pos.rx() = parentActionRect.right();
                if (pos.x() + menuSizeHint.width() > screen.x() + screen.width())
                    pos.rx() = parentActionRect.left() - menuSizeHint.width();
                if (pos.x() < screen.x())
                    pos.rx() = screen.x() + screen.width() - menuSizeHint.width();
            }
        }
    }
    popupScreen = QGuiApplication::screenAt(pos);
    q->setGeometry(QRect(pos, size));
#if QT_CONFIG(effects)
    int hGuess = q->isRightToLeft() ? QEffects::LeftScroll : QEffects::RightScroll;
    int vGuess = QEffects::DownScroll;
    if (q->isRightToLeft()) {
        if ((snapToMouse && (pos.x() + size.width() / 2 > mouse.x())) ||
           (qobject_cast<QMenu*>(causedPopup.widget) && pos.x() + size.width() / 2 > causedPopup.widget->x()))
            hGuess = QEffects::RightScroll;
    } else {
        if ((snapToMouse && (pos.x() + size.width() / 2 < mouse.x())) ||
           (qobject_cast<QMenu*>(causedPopup.widget) && pos.x() + size.width() / 2 < causedPopup.widget->x()))
            hGuess = QEffects::LeftScroll;
    }

#if QT_CONFIG(menubar)
    if ((snapToMouse && (pos.y() + size.height() / 2 < mouse.y())) ||
       (qobject_cast<QMenuBar*>(causedPopup.widget) &&
        pos.y() + size.width() / 2 < causedPopup.widget->mapToGlobal(causedPopup.widget->pos()).y()))
       vGuess = QEffects::UpScroll;
#endif
    if (QApplication::isEffectEnabled(Qt::UI_AnimateMenu)) {
        bool doChildEffects = true;
#if QT_CONFIG(menubar)
        if (QMenuBar *mb = qobject_cast<QMenuBar*>(causedPopup.widget)) {
            doChildEffects = mb->d_func()->doChildEffects;
            mb->d_func()->doChildEffects = false;
        } else
#endif
        if (QMenu *m = qobject_cast<QMenu*>(causedPopup.widget)) {
            doChildEffects = m->d_func()->doChildEffects;
            m->d_func()->doChildEffects = false;
        }

        if (doChildEffects) {
            if (QApplication::isEffectEnabled(Qt::UI_FadeMenu))
                qFadeEffect(q);
            else if (causedPopup.widget)
                qScrollEffect(q, qobject_cast<QMenu*>(causedPopup.widget) ? hGuess : vGuess);
            else
                qScrollEffect(q, hGuess | vGuess);
        } else {
            // kill any running effect
            qFadeEffect(nullptr);
            qScrollEffect(nullptr);

            q->show();
        }
    } else
#endif
    {
        q->show();
    }

#if QT_CONFIG(accessibility)
    QAccessibleEvent event(q, QAccessible::PopupMenuStart);
    QAccessible::updateAccessibility(&event);
#endif
}